

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.cxx
# Opt level: O2

string * cmCatViews_abi_cxx11_
                   (string *__return_storage_ptr__,
                   initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views)

{
  size_t __n;
  long lVar1;
  long lVar2;
  iterator pbVar3;
  long lVar4;
  pointer __dest;
  unsigned_long __n2;
  
  pbVar3 = views._M_array;
  lVar2 = views._M_len << 4;
  lVar4 = 0;
  for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 0x10) {
    lVar4 = lVar4 + *(long *)((long)&pbVar3->_M_len + lVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)lVar4);
  __dest = (__return_storage_ptr__->_M_dataplus)._M_p;
  for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 0x10) {
    __n = *(size_t *)((long)&pbVar3->_M_len + lVar1);
    if (__n != 0) {
      memmove(__dest,*(void **)((long)&pbVar3->_M_str + lVar1),__n);
      __dest = __dest + __n;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCatViews(std::initializer_list<cm::string_view> views)
{
  std::size_t total_size = 0;
  for (cm::string_view const& view : views) {
    total_size += view.size();
  }

  std::string result(total_size, '\0');
  std::string::iterator sit = result.begin();
  for (cm::string_view const& view : views) {
    sit = std::copy_n(view.data(), view.size(), sit);
  }
  return result;
}